

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O2

void udp_recv(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_b_1;
  sockaddr sockname;
  int namelen;
  
  sockname._0_8_ = nread;
  if (nread < 0) {
    pcVar4 = ">=";
    pcVar3 = "nread";
    uVar2 = 0xf8;
    pcVar5 = ">=";
LAB_0014026f:
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
            ,uVar2,pcVar3,pcVar4,"0",nread,pcVar5,0);
    abort();
  }
  free(buf->base);
  if (nread != 0) {
    sockname.sa_family = 0xffff;
    sockname.sa_data[0] = -1;
    sockname.sa_data[1] = -1;
    sockname.sa_data[2] = -1;
    sockname.sa_data[3] = -1;
    sockname.sa_data[4] = -1;
    sockname.sa_data[5] = -1;
    sockname.sa_data[6] = -1;
    sockname.sa_data[7] = -1;
    sockname.sa_data[8] = -1;
    sockname.sa_data[9] = -1;
    sockname.sa_data[10] = -1;
    sockname.sa_data[0xb] = -1;
    sockname.sa_data[0xc] = -1;
    sockname.sa_data[0xd] = -1;
    namelen = 0x10;
    iVar1 = uv_udp_getsockname(&udp,&sockname,&namelen);
    nread = (ssize_t)iVar1;
    if (nread != 0) {
      pcVar4 = "==";
      pcVar3 = "r";
      uVar2 = 0x102;
      pcVar5 = "==";
      goto LAB_0014026f;
    }
    check_sockname(&sockname,"0.0.0.0",0,"udp receiving socket");
    getsocknamecount_udp = getsocknamecount_udp + 1;
    uv_close((uv_handle_t *)&udp,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  }
  return;
}

Assistant:

static void udp_recv(uv_udp_t* handle,
                     ssize_t nread,
                     const uv_buf_t* buf,
                     const struct sockaddr* addr,
                     unsigned flags) {
  struct sockaddr sockname;
  int namelen;
  int r;

  ASSERT_GE(nread, 0);
  free(buf->base);

  if (nread == 0) {
    return;
  }

  memset(&sockname, -1, sizeof sockname);
  namelen = sizeof(sockname);
  r = uv_udp_getsockname(&udp, &sockname, &namelen);
  ASSERT_OK(r);
  check_sockname(&sockname, "0.0.0.0", 0, "udp receiving socket");
  getsocknamecount_udp++;

  uv_close((uv_handle_t*) &udp, NULL);
  uv_close((uv_handle_t*) handle, NULL);
}